

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

OSToken * OSToken::createToken
                    (string *basePath,string *tokenDir,int umask,ByteString *label,
                    ByteString *serial)

{
  bool bVar1;
  int iVar2;
  OSToken *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_368 [32];
  string local_348;
  Directory baseDir;
  OSAttribute tokenFlags;
  OSAttribute tokenSerial;
  OSAttribute tokenLabel;
  ObjectFile tokenObject;
  
  std::__cxx11::string::string((string *)&local_348,(string *)basePath);
  Directory::Directory(&baseDir,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  bVar1 = Directory::isValid(&baseDir);
  if (!bVar1) {
    this = (OSToken *)0x0;
    softHSMLog(3,"createToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x4d,"Could not create the Directory object");
    goto LAB_00128521;
  }
  std::__cxx11::string::string(local_368,(string *)tokenDir);
  iVar2 = Directory::mkdir(&baseDir,(char *)local_368,umask);
  std::__cxx11::string::~string(local_368);
  if ((char)iVar2 == '\0') {
    this = (OSToken *)0x0;
    goto LAB_00128521;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenFlags,
                 basePath,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenSerial,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenFlags,
                 tokenDir);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenLabel,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenSerial,
                 "/");
  std::operator+(&local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenLabel,
                 "token.object");
  std::operator+(&local_3e8,basePath,"/");
  std::operator+(&local_3c8,&local_3e8,tokenDir);
  std::operator+(&bStack_4a8,&local_3c8,"/");
  std::operator+(&local_3a8,&bStack_4a8,"token.lock");
  ObjectFile::ObjectFile(&tokenObject,(OSToken *)0x0,&local_388,umask,&local_3a8,true);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&bStack_4a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&tokenLabel);
  std::__cxx11::string::~string((string *)&tokenSerial);
  std::__cxx11::string::~string((string *)&tokenFlags);
  if (tokenObject.valid == false) {
    std::operator+(&bStack_4a8,basePath,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenFlags,
                   &bStack_4a8,tokenDir);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenSerial
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenFlags
                   ,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenLabel,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenSerial
                   ,"token.[object|lock]");
    std::__cxx11::string::~string((string *)&tokenSerial);
    std::__cxx11::string::~string((string *)&tokenFlags);
    std::__cxx11::string::~string((string *)&bStack_4a8);
    softHSMLog(3,"createToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x5e,"Failed to create the token object: %s",tokenLabel._vptr_OSAttribute);
    std::__cxx11::string::string(local_408,(string *)tokenDir);
    Directory::rmdir(&baseDir,(char *)local_408);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string((string *)&tokenLabel);
    this = (OSToken *)0x0;
  }
  else {
    OSAttribute::OSAttribute(&tokenLabel,label);
    OSAttribute::OSAttribute(&tokenSerial,serial);
    OSAttribute::OSAttribute(&tokenFlags,0xc00425);
    bVar1 = ObjectFile::setAttribute(&tokenObject,0x80005349,&tokenLabel);
    if (bVar1) {
      bVar1 = ObjectFile::setAttribute(&tokenObject,0x8000534a,&tokenSerial);
      if (!bVar1) goto LAB_00128400;
      bVar1 = ObjectFile::setAttribute(&tokenObject,0x8000534b,&tokenFlags);
      if (!bVar1) goto LAB_00128400;
      softHSMLog(7,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x7f,"Created new token %s",(tokenDir->_M_dataplus)._M_p);
      this = (OSToken *)operator_new(0xe8);
      std::operator+(&bStack_4a8,basePath,"/");
      std::operator+(&local_488,&bStack_4a8,tokenDir);
      OSToken(this,&local_488,umask);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&bStack_4a8);
    }
    else {
LAB_00128400:
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x76,"Failed to set the token attributes");
      std::operator+(&bStack_4a8,tokenDir,"/");
      std::operator+(&local_428,&bStack_4a8,"token.object");
      Directory::remove(&baseDir,(char *)&local_428);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&bStack_4a8);
      std::operator+(&bStack_4a8,tokenDir,"/");
      std::operator+(&local_448,&bStack_4a8,"token.lock");
      Directory::remove(&baseDir,(char *)&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&bStack_4a8);
      std::__cxx11::string::string(local_468,(string *)tokenDir);
      Directory::rmdir(&baseDir,(char *)local_468);
      std::__cxx11::string::~string(local_468);
      this = (OSToken *)0x0;
    }
    OSAttribute::~OSAttribute(&tokenFlags);
    OSAttribute::~OSAttribute(&tokenSerial);
    OSAttribute::~OSAttribute(&tokenLabel);
  }
  ObjectFile::~ObjectFile(&tokenObject);
LAB_00128521:
  Directory::~Directory(&baseDir);
  return this;
}

Assistant:

OSToken* OSToken::createToken(const std::string basePath, const std::string tokenDir, int umask, const ByteString& label, const ByteString& serial)
{
	Directory baseDir(basePath);

	if (!baseDir.isValid())
	{
		ERROR_MSG("Could not create the Directory object");
		return NULL;
	}

	// Create the token directory
	if (!baseDir.mkdir(tokenDir, umask))
	{
		// Error msg is generated by mkdir
		return NULL;
	}

	// Create the token object
	ObjectFile tokenObject(NULL, basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.object", umask, basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.lock", true);

	if (!tokenObject.valid)
	{
		std::string tokenPath = basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.[object|lock]";
		ERROR_MSG("Failed to create the token object: %s", tokenPath.c_str());

		baseDir.rmdir(tokenDir);

		return NULL;
	}

	// Set the initial attributes
	CK_ULONG flags =
		CKF_RNG |
		CKF_LOGIN_REQUIRED | // FIXME: check
		CKF_RESTORE_KEY_NOT_NEEDED |
		CKF_TOKEN_INITIALIZED |
		CKF_SO_PIN_LOCKED |
		CKF_SO_PIN_TO_BE_CHANGED;

	OSAttribute tokenLabel(label);
	OSAttribute tokenSerial(serial);
	OSAttribute tokenFlags(flags);

	if (!tokenObject.setAttribute(CKA_OS_TOKENLABEL, tokenLabel) ||
	    !tokenObject.setAttribute(CKA_OS_TOKENSERIAL, tokenSerial) ||
	    !tokenObject.setAttribute(CKA_OS_TOKENFLAGS, tokenFlags))
	{
		ERROR_MSG("Failed to set the token attributes");

		baseDir.remove(tokenDir + OS_PATHSEP + "token.object");
		baseDir.remove(tokenDir + OS_PATHSEP + "token.lock");
		baseDir.rmdir(tokenDir);

		return NULL;
	}

	DEBUG_MSG("Created new token %s", tokenDir.c_str());

	return new OSToken(basePath + OS_PATHSEP + tokenDir, umask);
}